

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  byte bVar1;
  bool bVar2;
  LocalGeneratorVector *this_00;
  const_reference this_01;
  pointer pcVar3;
  cmMakefile *this_02;
  string *psVar4;
  ulong uVar5;
  type pcVar6;
  cmState *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d60;
  string local_be0;
  undefined1 local_bc0 [8];
  string linkSourceDirectory;
  undefined1 local_b98 [8];
  string sourceLinkedResourceName;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  reference local_b28;
  string *n_1;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  iterator local_ae0;
  size_type local_ad8;
  undefined1 local_ad0 [8];
  cmList extraNatures;
  string local_ab0;
  cmValue local_a90;
  cmValue extraNaturesProp;
  string local_a80;
  reference local_a60;
  string *n;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  allocator<char> local_971;
  string local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  undefined1 local_930 [8];
  ostringstream errorOutputParser;
  string local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  undefined1 local_778 [8];
  ostringstream environment;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  string local_458;
  allocator<char> local_431;
  string local_430;
  string local_410;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  undefined1 local_380 [8];
  cmXMLWriter xml;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  string compilerId;
  undefined1 local_2a8 [8];
  cmGeneratedFileStream fout;
  string filename;
  cmMakefile *mf;
  value_type *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  this_01 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::operator[](this_00,0);
  pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     (this_01);
  this_02 = cmLocalGenerator::GetMakefile(pcVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x260,&this->HomeOutputDirectory,"/.project");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2a8,(string *)&fout.field_0x260,false,None);
  bVar1 = std::ios::operator!((ios *)(local_2a8 + (long)*(_func_int **)((long)local_2a8 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"CMAKE_C_COMPILER_ID",&local_2f9);
    psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_2f8);
    std::__cxx11::string::string((string *)local_2d8,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"CMAKE_CXX_COMPILER_ID",(allocator<char> *)&xml.field_0x57);
      psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_320);
      std::__cxx11::string::operator=((string *)local_2d8,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
    }
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_380,(ostream *)local_2a8,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_380,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"projectDescription",&local_3a1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"name",&local_3c9);
    pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_01);
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_410,pcVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"CMAKE_BUILD_TYPE",&local_431);
    psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_430);
    GetPathBasename(&local_458,&this->HomeOutputDirectory);
    GenerateProjectName(&local_3f0,&local_410,psVar4,&local_458);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_3c8,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"comment",&local_479);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_380,&local_478,(char (*) [1])0x1198ba7);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"projects",&local_4a1);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_380,&local_4a0,(char (*) [1])0x1198ba7);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"buildSpec",&local_4c9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"buildCommand",&local_4f1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"name",&local_519);
    cmXMLWriter::Element<char[38]>
              ((cmXMLWriter *)local_380,&local_518,
               (char (*) [38])"org.eclipse.cdt.make.core.makeBuilder");
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"triggers",&local_541);
    cmXMLWriter::Element<char[24]>
              ((cmXMLWriter *)local_380,&local_540,(char (*) [24])"clean,full,incremental,");
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator(&local_541);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"arguments",&local_569);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.cleanBuildTarget",
               (char (*) [6])0x116b8d0);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.enableCleanBuild",
               (char (*) [5])0x117d342);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.append_environment",
               (char (*) [5])0x117d342);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.stopOnError",
               (char (*) [5])0x117d342);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.enabledIncrementalBuild",
               (char (*) [5])0x117d342);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b0,"CMAKE_MAKE_PROGRAM",&local_5b1);
    psVar4 = cmMakefile::GetRequiredDefinition(this_02,&local_5b0);
    GetEclipsePath(&local_590,psVar4);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.build.command",&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    AppendDictionary<char[47]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.contents",
               (char (*) [47])"org.eclipse.cdt.make.core.activeConfigSettings");
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.build.target.inc",
               (char (*) [4])0x11034b4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"CMAKE_ECLIPSE_MAKE_ARGUMENTS",&local_5d9);
    psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_5d8);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.build.arguments",psVar4);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    GetEclipsePath(&local_600,&this->HomeOutputDirectory);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.buildLocation",&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.useDefaultBuildCmd",
               (char (*) [6])0x11480b2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_778);
    std::operator<<((ostream *)local_778,"VERBOSE=1|CMAKE_NO_VERBOSE=1|");
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2d8,"MSVC");
    if (bVar2) {
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator*
                         (this_01);
      AddEnvVar((ostream *)local_778,"PATH",pcVar6);
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator*
                         (this_01);
      AddEnvVar((ostream *)local_778,"INCLUDE",pcVar6);
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator*
                         (this_01);
      AddEnvVar((ostream *)local_778,"LIB",pcVar6);
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator*
                         (this_01);
      AddEnvVar((ostream *)local_778,"LIBPATH",pcVar6);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2d8,"Intel");
      if (bVar2) {
        pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                 operator*(this_01);
        AddEnvVar((ostream *)local_778,"INTEL_LICENSE_FILE",pcVar6);
      }
    }
    std::__cxx11::ostringstream::str();
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.environment",&local_798);
    std::__cxx11::string::~string((string *)&local_798);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.enableFullBuild",
               (char (*) [5])0x117d342);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.build.target.auto",
               (char (*) [4])0x11034b4);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.enableAutoBuild",
               (char (*) [6])0x11480b2);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.build.target.clean",
               (char (*) [6])0x116b8d0);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.fullBuildTarget",
               (char (*) [4])0x11034b4);
    AppendDictionary<char[1]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.buildArguments",
               (char (*) [1])0x1198ba7);
    GetEclipsePath(&local_7b8,&this->HomeOutputDirectory);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.build.location",&local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.make.core.autoBuildTarget",
               (char (*) [4])0x11034b4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_930);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2d8,"MSVC");
    if (bVar2) {
      std::operator<<((ostream *)local_930,"org.eclipse.cdt.core.VCErrorParser;");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2d8,"Intel");
      if (bVar2) {
        std::operator<<((ostream *)local_930,"org.eclipse.cdt.core.ICCErrorParser;");
      }
    }
    if ((this->SupportsGmakeErrorParser & 1U) == 0) {
      std::operator<<((ostream *)local_930,"org.eclipse.cdt.core.MakeErrorParser;");
    }
    else {
      std::operator<<((ostream *)local_930,"org.eclipse.cdt.core.GmakeErrorParser;");
    }
    std::operator<<((ostream *)local_930,
                    "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;"
                   );
    std::__cxx11::ostringstream::str();
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_380,"org.eclipse.cdt.core.errorOutputParser",&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_970,"buildCommand",&local_971);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::allocator<char>::~allocator(&local_971);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"name",&local_999);
    cmXMLWriter::Element<char[47]>
              ((cmXMLWriter *)local_380,&local_998,
               (char (*) [47])"org.eclipse.cdt.make.core.ScannerConfigBuilder");
    std::__cxx11::string::~string((string *)&local_998);
    std::allocator<char>::~allocator(&local_999);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c0,"arguments",&local_9c1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_9c0);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::allocator<char>::~allocator(&local_9c1);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"natures",&local_9e9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_9e8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a10,"nature",&local_a11);
    cmXMLWriter::Element<char[37]>
              ((cmXMLWriter *)local_380,&local_a10,
               (char (*) [37])"org.eclipse.cdt.make.core.makeNature");
    std::__cxx11::string::~string((string *)&local_a10);
    std::allocator<char>::~allocator(&local_a11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a38,"nature",(allocator<char> *)((long)&__range1 + 7));
    cmXMLWriter::Element<char[46]>
              ((cmXMLWriter *)local_380,&local_a38,
               (char (*) [46])"org.eclipse.cdt.make.core.ScannerConfigNature");
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    __end1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Natures);
    n = (string *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Natures);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&n), bVar2) {
      local_a60 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a80,"nature",
                 (allocator<char> *)((long)&extraNaturesProp.Value + 7));
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_a80,local_a60);
      std::__cxx11::string::~string((string *)&local_a80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraNaturesProp.Value + 7));
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    this_03 = cmMakefile::GetState(this_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"ECLIPSE_EXTRA_NATURES",
               (allocator<char> *)
               ((long)&extraNatures.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_a90 = cmState::GetGlobalProperty(this_03,&local_ab0);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extraNatures.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = cmValue::operator_cast_to_bool(&local_a90);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_a90);
      std::__cxx11::string::string((string *)&local_b00,(string *)psVar4);
      local_ae0 = &local_b00;
      local_ad8 = 1;
      init._M_len = 1;
      init._M_array = local_ae0;
      cmList::cmList((cmList *)local_ad0,init);
      local_d60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ae0;
      do {
        local_d60 = local_d60 + -1;
        std::__cxx11::string::~string((string *)local_d60);
      } while (local_d60 != &local_b00);
      __end2 = cmList::begin_abi_cxx11_((cmList *)local_ad0);
      n_1 = (string *)cmList::end_abi_cxx11_((cmList *)local_ad0);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&n_1), bVar2) {
        local_b28 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"nature",&local_b49)
        ;
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_380,&local_b48,local_b28);
        std::__cxx11::string::~string((string *)&local_b48);
        std::allocator<char>::~allocator(&local_b49);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      cmList::~cmList((cmList *)local_ad0);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b70,"linkedResources",
               (allocator<char> *)(sourceLinkedResourceName.field_2._M_local_buf + 0xf));
    cmXMLWriter::StartElement((cmXMLWriter *)local_380,&local_b70);
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator
              ((allocator<char> *)(sourceLinkedResourceName.field_2._M_local_buf + 0xf));
    if ((this->IsOutOfSourceBuild & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b98,"[Source directory]",
                 (allocator<char> *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (this_01);
      psVar4 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar3);
      GetEclipsePath((string *)local_bc0,psVar4);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&this->HomeOutputDirectory,(string *)local_bc0);
      if (!bVar2) {
        GetEclipsePath(&local_be0,(string *)local_bc0);
        AppendLinkedResource((cmXMLWriter *)local_380,(string *)local_b98,&local_be0,LinkToFolder);
        std::__cxx11::string::~string((string *)&local_be0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->SrcLinkedResources,(value_type *)local_b98);
      }
      std::__cxx11::string::~string((string *)local_bc0);
      std::__cxx11::string::~string((string *)local_b98);
    }
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_380,&this->HomeOutputDirectory);
      CreateLinksForTargets(this,(cmXMLWriter *)local_380);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    cmXMLWriter::EndElement((cmXMLWriter *)local_380);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_930);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_778);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_380);
    std::__cxx11::string::~string((string *)local_2d8);
    compilerId.field_2._8_4_ = 0;
  }
  else {
    compilerId.field_2._8_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a8);
  std::__cxx11::string::~string((string *)&fout.field_0x260);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty()) // no C compiler, try the C++ compiler:
  {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
  }

  cmXMLWriter xml(fout);

  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");

  xml.Element("name",
              cmExtraEclipseCDT4Generator::GenerateProjectName(
                lg->GetProjectName(),
                mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                cmExtraEclipseCDT4Generator::GetPathBasename(
                  this->HomeOutputDirectory)));

  xml.Element("comment", "");
  xml.Element("projects", "");

  xml.StartElement("buildSpec");
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.makeBuilder");
  xml.Element("triggers", "clean,full,incremental,");
  xml.StartElement("arguments");

  // use clean target
  AppendDictionary(xml, "org.eclipse.cdt.make.core.cleanBuildTarget", "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableCleanBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.append_environment",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.stopOnError", "true");

  // set the make command
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enabledIncrementalBuild",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.command",
                   cmExtraEclipseCDT4Generator::GetEclipsePath(
                     mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.contents",
                   "org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.inc", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.arguments",
                   mf->GetSafeDefinition("CMAKE_ECLIPSE_MAKE_ARGUMENTS"));
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.buildLocation",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.useDefaultBuildCmd",
                   "false");

  // set project specific environment
  std::ostringstream environment;
  environment << "VERBOSE=1|CMAKE_NO_VERBOSE=1|"; // verbose Makefile output
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC") {
    AddEnvVar(environment, "PATH", *lg);
    AddEnvVar(environment, "INCLUDE", *lg);
    AddEnvVar(environment, "LIB", *lg);
    AddEnvVar(environment, "LIBPATH", *lg);
  } else if (compilerId == "Intel") {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(environment, "INTEL_LICENSE_FILE", *lg);
  }
  AppendDictionary(xml, "org.eclipse.cdt.make.core.environment",
                   environment.str());

  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableFullBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.auto", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableAutoBuild", "false");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.clean",
                   "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.fullBuildTarget", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildArguments", "");
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.build.location",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.autoBuildTarget", "all");

  // set error parsers
  std::ostringstream errorOutputParser;

  if (compilerId == "MSVC") {
    errorOutputParser << "org.eclipse.cdt.core.VCErrorParser;";
  } else if (compilerId == "Intel") {
    errorOutputParser << "org.eclipse.cdt.core.ICCErrorParser;";
  }

  if (this->SupportsGmakeErrorParser) {
    errorOutputParser << "org.eclipse.cdt.core.GmakeErrorParser;";
  } else {
    errorOutputParser << "org.eclipse.cdt.core.MakeErrorParser;";
  }

  errorOutputParser << "org.eclipse.cdt.core.GCCErrorParser;"
                       "org.eclipse.cdt.core.GASErrorParser;"
                       "org.eclipse.cdt.core.GLDErrorParser;";
  AppendDictionary(xml, "org.eclipse.cdt.core.errorOutputParser",
                   errorOutputParser.str());

  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.ScannerConfigBuilder");
  xml.StartElement("arguments");
  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.EndElement(); // buildSpec

  // set natures for c/c++ projects
  xml.StartElement("natures");
  xml.Element("nature", "org.eclipse.cdt.make.core.makeNature");
  xml.Element("nature", "org.eclipse.cdt.make.core.ScannerConfigNature");

  for (std::string const& n : this->Natures) {
    xml.Element("nature", n);
  }

  if (cmValue extraNaturesProp =
        mf->GetState()->GetGlobalProperty("ECLIPSE_EXTRA_NATURES")) {
    cmList extraNatures{ *extraNaturesProp };
    for (std::string const& n : extraNatures) {
      xml.Element("nature", n);
    }
  }

  xml.EndElement(); // natures

  xml.StartElement("linkedResources");
  // create linked resources
  if (this->IsOutOfSourceBuild) {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // https://gitlab.kitware.com/cmake/cmake/-/issues/9978 and because I found
    // it actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                       linkSourceDirectory)) {
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, sourceLinkedResourceName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      this->SrcLinkedResources.push_back(std::move(sourceLinkedResourceName));
    }
  }

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeOutputDirectory);

    this->CreateLinksForTargets(xml);
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
}